

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::AdjustTexturePath(LWOImporter *this,string *out)

{
  char *pcVar1;
  Logger *this_00;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (this->mIsLWO2 == false) {
    pcVar1 = strstr((out->_M_dataplus)._M_p,"(sequence)");
    if (pcVar1 != (char *)0x0) {
      this_00 = DefaultLogger::get();
      Logger::info(this_00,"LWOB: Sequence of animated texture found. It will be ignored");
      std::__cxx11::string::substr((ulong)local_38,(ulong)out);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_38);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_48 = *plVar4;
        lStack_40 = plVar2[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar4;
        local_58 = (long *)*plVar2;
      }
      local_50 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)out,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
      }
    }
  }
  lVar3 = std::__cxx11::string::find((char)out,0x3a);
  if (lVar3 != -1) {
    std::__cxx11::string::replace((ulong)out,lVar3 + 1,(char *)0x0,0x7252a8);
  }
  return;
}

Assistant:

void LWOImporter::AdjustTexturePath(std::string& out)
{
    // --- this function is used for both LWO2 and LWOB
    if (!mIsLWO2 && ::strstr(out.c_str(), "(sequence)"))    {

        // remove the (sequence) and append 000
        ASSIMP_LOG_INFO("LWOB: Sequence of animated texture found. It will be ignored");
        out = out.substr(0,out.length()-10) + "000";
    }

    // format: drive:path/file - we just need to insert a slash after the drive
    std::string::size_type n = out.find_first_of(':');
    if (std::string::npos != n) {
        out.insert(n+1,"/");
    }
}